

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

RealType __thiscall OpenMD::Thermo::getTemperature(Thermo *this)

{
  int iVar1;
  Snapshot *this_00;
  int iVar2;
  RealType RVar3;
  RealType RVar4;
  RealType temp;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasTemperature == false) {
    RVar3 = getTranslationalKinetic(this);
    RVar4 = getRotationalKinetic(this);
    iVar1 = this->info_->ndf_;
    iVar2 = SimInfo::getFdf(this->info_);
    temp = 0.0;
    if (iVar2 < iVar1) {
      iVar1 = this->info_->ndf_;
      iVar2 = SimInfo::getFdf(this->info_);
      temp = (RVar3 + RVar4 + RVar3 + RVar4) / ((double)(iVar1 - iVar2) * 0.0019872156);
    }
    Snapshot::setTemperature(this_00,temp);
  }
  RVar3 = Snapshot::getTemperature(this_00);
  return RVar3;
}

Assistant:

RealType Thermo::getTemperature() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasTemperature) {
      RealType nuclearKE =
          this->getTranslationalKinetic() + this->getRotationalKinetic();

      RealType temperature {};

      // With no degrees of freedom, T is not well defined, but we'll
      // set to zero.

      if (info_->getNdf() > 0)
        temperature = (2.0 * nuclearKE) / (info_->getNdf() * Constants::kb);
      else
        temperature = 0.0;

      snap->setTemperature(temperature);
    }

    return snap->getTemperature();
  }